

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O0

double __thiscall iir_filter<3>::operator()(iir_filter<3> *this,double in)

{
  double dVar1;
  iterator pvVar2;
  double dVar3;
  double dVar4;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  pointer local_20;
  double yvn;
  double in_local;
  iir_filter<3> *this_local;
  
  yvn = in;
  in_local = (double)this;
  boost::circular_buffer<double,_std::allocator<double>_>::push_front(&this->xv_m,&yvn);
  dVar1 = this->gain_m;
  boost::circular_buffer<double,_std::allocator<double>_>::begin
            ((circular_buffer<double,_std::allocator<double>_> *)&stack0xffffffffffffffd0);
  boost::circular_buffer<double,_std::allocator<double>_>::end
            ((circular_buffer<double,_std::allocator<double>_> *)local_40);
  pvVar2 = std::array<double,_4UL>::begin(&this->b_m);
  dVar3 = std::
          inner_product<boost::cb_details::iterator<boost::circular_buffer<double,std::allocator<double>>,boost::cb_details::nonconst_traits<std::allocator<double>>>,double*,double>
                    ((iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
                      *)&stack0xffffffffffffffd0,
                     (iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
                      *)local_40,pvVar2,0.0);
  boost::circular_buffer<double,_std::allocator<double>_>::begin
            ((circular_buffer<double,_std::allocator<double>_> *)local_50);
  boost::circular_buffer<double,_std::allocator<double>_>::end
            ((circular_buffer<double,_std::allocator<double>_> *)local_60);
  pvVar2 = std::array<double,_4UL>::begin(&this->a_m);
  dVar4 = std::
          inner_product<boost::cb_details::iterator<boost::circular_buffer<double,std::allocator<double>>,boost::cb_details::nonconst_traits<std::allocator<double>>>,double*,double>
                    ((iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
                      *)local_50,
                     (iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
                      *)local_60,pvVar2 + 1,0.0);
  local_20 = (pointer)(dVar1 * dVar3 + -dVar4);
  boost::circular_buffer<double,_std::allocator<double>_>::push_front
            (&this->yv_m,(param_value_type)&stack0xffffffffffffffe0);
  return (double)local_20;
}

Assistant:

double operator()(double in)
    {
        xv_m.push_front(in);
        double yvn =
            gain_m * std::inner_product(xv_m.begin(), xv_m.end(), b_m.begin(), 0.0) -
            std::inner_product(yv_m.begin(), yv_m.end(), a_m.begin() + 1, 0.0);
        yv_m.push_front(yvn);
        return yvn;
    }